

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::TokenManager::ParsePublicKey
          (Error *__return_storage_ptr__,TokenManager *this,mbedtls_pk_context *aPublicKey,
          ByteArray *aCert)

{
  string *this_00;
  uchar *buf;
  uchar *puVar1;
  pointer pcVar2;
  int aMbedtlsError;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  mbedtls_x509_crt_conflict cert;
  undefined1 local_398 [8];
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  parse_func local_370 [1];
  string local_360;
  ErrorCode local_340;
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  mbedtls_x509_crt local_318;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  mbedtls_x509_crt_init(&local_318);
  buf = (aCert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (aCert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (buf == puVar1) {
    local_398._0_4_ = none_type;
    local_390._M_p = "the raw certificate is empty";
    local_388 = 0x1c;
    local_380._M_allocated_capacity = 0;
    local_370[0] = (parse_func)0x0;
    begin = "the raw certificate is empty";
    local_380._8_8_ = local_398;
    do {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_398);
      }
      begin = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_398;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_360,(v10 *)"the raw certificate is empty",(string_view)ZEXT816(0x1c),args);
    local_340 = kInvalidArgs;
    local_338[0] = local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_338,local_360._M_dataplus._M_p,
               local_360._M_dataplus._M_p + local_360._M_string_length);
    __return_storage_ptr__->mCode = local_340;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_338);
    if (local_338[0] != local_328) {
      operator_delete(local_338[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_0018cc20;
  }
  else {
    aMbedtlsError = mbedtls_x509_crt_parse(&local_318,buf,(long)puVar1 - (long)buf);
    if (aMbedtlsError == 0) {
      mbedtls_pk_free((mbedtls_pk_context_conflict *)aPublicKey);
      aPublicKey->private_priv_id = local_318.pk.priv_id;
      *(undefined4 *)&aPublicKey->field_0x14 = local_318.pk._20_4_;
      aPublicKey->private_pk_info = local_318.pk.pk_info;
      aPublicKey->private_pk_ctx = local_318.pk.pk_ctx;
      mbedtls_pk_init(&local_318.pk);
      goto LAB_0018cc20;
    }
    ErrorFromMbedtlsError((Error *)local_398,aMbedtlsError);
    __return_storage_ptr__->mCode = local_398._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_p != &local_380) {
      operator_delete(local_390._M_p);
    }
    local_398._0_4_ = uint_type;
    pcVar2 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
    local_390._M_p = (pointer)&local_380;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_390,pcVar2,
               pcVar2 + (__return_storage_ptr__->mMessage)._M_string_length);
    __return_storage_ptr__->mCode = local_398._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_390);
    local_360._M_dataplus._M_p = local_390._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_p == &local_380) goto LAB_0018cc20;
  }
  operator_delete(local_360._M_dataplus._M_p);
LAB_0018cc20:
  mbedtls_x509_crt_free(&local_318);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ParsePublicKey(mbedtls_pk_context &aPublicKey, const ByteArray &aCert)
{
    Error            error;
    mbedtls_x509_crt cert;

    mbedtls_x509_crt_init(&cert);

    VerifyOrExit(!aCert.empty(), error = ERROR_INVALID_ARGS("the raw certificate is empty"));
    if (int fail = mbedtls_x509_crt_parse(&cert, aCert.data(), aCert.size()))
    {
        error = ErrorFromMbedtlsError(fail);
        ExitNow(error = {ErrorCode::kInvalidArgs, error.GetMessage()});
    }

    // Steal the public key from the 'cert' object.
    MoveMbedtlsKey(aPublicKey, cert.pk);

exit:
    mbedtls_x509_crt_free(&cert);

    return error;
}